

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::push(BrandScope *this,uint64_t typeId,uint paramCount)

{
  undefined4 in_register_00000014;
  BrandScope *extraout_RDX;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar1;
  undefined1 local_38 [28];
  uint paramCount_local;
  uint64_t typeId_local;
  BrandScope *this_local;
  
  register0x00000010 = (PromiseArena *)CONCAT44(in_register_00000014,paramCount);
  typeId_local = typeId;
  this_local = this;
  kj::addRef<capnp::compiler::BrandScope>((kj *)local_38,(BrandScope *)typeId);
  kj::
  refcounted<capnp::compiler::BrandScope,kj::Own<capnp::compiler::BrandScope,decltype(nullptr)>,unsigned_long&,unsigned_int&>
            ((kj *)this,(Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_38,
             (unsigned_long *)(local_38 + 0x18),(uint *)(local_38 + 0x14));
  kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
            ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<BrandScope> BrandScope::push(uint64_t typeId, uint paramCount) {
  return kj::refcounted<BrandScope>(kj::addRef(*this), typeId, paramCount);
}